

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxOutByHandle(void *handle,void *tx_data_handle,uint32_t index,int64_t *value_satoshi,
                       char **locking_script,char **asset)

{
  ConfidentialTransaction *this;
  char *pcVar1;
  char *pcVar2;
  int64_t iVar3;
  CfdException *this_00;
  bool is_bitcoin;
  Amount local_1f8;
  char *work_asset;
  char *work_script;
  Script local_1d8;
  string temp_asset;
  Script temp_locking_script;
  TxOutReference ref;
  ConfidentialAssetId local_f8 [4];
  string local_50;
  
  work_script = (char *)0x0;
  work_asset = (char *)0x0;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ref,"TransactionData",(allocator *)&temp_locking_script);
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  cfd::core::Amount::Amount(&local_1f8);
  cfd::core::Script::Script(&temp_locking_script);
  temp_asset._M_dataplus._M_p = (pointer)&temp_asset.field_2;
  temp_asset._M_string_length = 0;
  temp_asset.field_2._M_local_buf[0] = '\0';
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    if (is_bitcoin == true) {
      cfd::core::Transaction::GetTxOut(&ref,(Transaction *)this,index);
      local_1f8.amount_ = ref.super_AbstractTxOutReference.value_.amount_;
      local_1f8.ignore_check_ = ref.super_AbstractTxOutReference.value_.ignore_check_;
      cfd::core::Script::Script(&local_1d8,&ref.super_AbstractTxOutReference.locking_script_);
      cfd::core::Script::operator=(&temp_locking_script,&local_1d8);
      cfd::core::Script::~Script(&local_1d8);
      cfd::core::AbstractTxOutReference::~AbstractTxOutReference(&ref.super_AbstractTxOutReference);
    }
    else {
      cfd::core::ConfidentialTransaction::GetTxOut((ConfidentialTxOutReference *)&ref,this,index);
      local_1f8.amount_ = ref.super_AbstractTxOutReference.value_.amount_;
      local_1f8.ignore_check_ = ref.super_AbstractTxOutReference.value_.ignore_check_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&local_1d8,local_f8);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_50,(ConfidentialAssetId *)&local_1d8)
      ;
      std::__cxx11::string::operator=((string *)&temp_asset,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&local_1d8);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)&ref);
    }
    if (locking_script == (char **)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&ref,&temp_locking_script);
      pcVar1 = cfd::capi::CreateString((string *)&ref);
      work_script = pcVar1;
      std::__cxx11::string::~string((string *)&ref);
    }
    if (asset == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = cfd::capi::CreateString(&temp_asset);
      work_asset = pcVar2;
    }
    if (value_satoshi != (int64_t *)0x0) {
      iVar3 = cfd::core::Amount::GetSatoshiValue(&local_1f8);
      *value_satoshi = iVar3;
    }
    if (locking_script != (char **)0x0) {
      *locking_script = pcVar1;
    }
    if (asset != (char **)0x0) {
      *asset = pcVar2;
    }
    std::__cxx11::string::~string((string *)&temp_asset);
    cfd::core::Script::~Script(&temp_locking_script);
    return 0;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ref,"Invalid handle state. tx is null",(allocator *)&local_1d8);
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&ref);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxOutByHandle(
    void* handle, void* tx_data_handle, uint32_t index, int64_t* value_satoshi,
    char** locking_script, char** asset) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  char* work_script = nullptr;
  char* work_asset = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    Amount temp_value;
    Script temp_locking_script;
    std::string temp_asset;
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxOutReference ref = tx->GetTxOut(index);
      temp_value = ref.GetValue();
      temp_locking_script = ref.GetLockingScript();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxOutReference ref = tx->GetTxOut(index);
      temp_value = ref.GetValue();
      temp_asset = ref.GetAsset().GetHex();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (locking_script != nullptr) {
      work_script = CreateString(temp_locking_script.GetHex());
    }
    if (asset != nullptr) work_asset = CreateString(temp_asset);

    if (value_satoshi != nullptr) {
      *value_satoshi = temp_value.GetSatoshiValue();
    }
    if (locking_script != nullptr) *locking_script = work_script;
    if (asset != nullptr) *asset = work_asset;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_script, &work_asset);
  return error_code;
}